

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SliceObjectHelper
              (RecyclableObject *obj,uint32 sliceStart,uint32 start,JavascriptArray *newArr,
              RecyclableObject *newObj,uint32 newLen,ScriptContext *scriptContext)

{
  code *pcVar1;
  double value;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  JavascriptArray *pJVar8;
  uint32 i;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  jsReentLock._24_8_ = newObj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  if (start < newLen) {
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar3 = JavascriptOperators::HasItem(obj,sliceStart + start);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar3 != 0) {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar4 = JavascriptOperators::GetItem(obj,sliceStart + start,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (newArr == (JavascriptArray *)0x0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar3 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x148))
                            (jsReentLock._24_8_,start,pvVar4,4);
          ThrowErrorOnFailure(BVar3,scriptContext,start);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
        else {
          (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (newArr,(ulong)start,pvVar4,0);
        }
      }
      start = start + 1;
    } while (newLen != start);
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if ((int)newLen < 0) {
    value = (double)newLen;
    uVar5 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar6 = NumberUtilities::ToSpecial(value);
      if (uVar6 != 0xfff8000000000000) {
        uVar6 = NumberUtilities::ToSpecial(value);
        if (uVar6 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
      }
    }
    pvVar4 = (Var)(uVar5 ^ 0xfffc000000000000);
  }
  else {
    pvVar4 = (Var)((ulong)newLen | 0x1000000000000);
  }
  JavascriptOperators::SetProperty
            ((Var)jsReentLock._24_8_,(RecyclableObject *)jsReentLock._24_8_,0xd1,pvVar4,
             scriptContext,PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  bVar2 = IsNonES5Array((Var)jsReentLock._24_8_);
  if (bVar2) {
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>((Var)jsReentLock._24_8_);
  }
  else {
    pJVar8 = (JavascriptArray *)0x0;
  }
  if (pJVar8 != (JavascriptArray *)0x0) {
    (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (Var)jsReentLock._24_8_;
}

Assistant:

Var JavascriptArray::SliceObjectHelper(RecyclableObject* obj, uint32 sliceStart, uint32 start, JavascriptArray* newArr, RecyclableObject* newObj, uint32 newLen, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        for (uint32 i = start; i < newLen; i++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i + sliceStart));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(obj, i + sliceStart, scriptContext));
                if (newArr != nullptr)
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));
                }
            }
        }

        JS_REENTRANT(jsReentLock,
            JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }